

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

void __thiscall HRDParams::resetDefault(HRDParams *this,bool mvc)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  bool bVar3;
  
  this->isPresent = false;
  this->bitLen = 0;
  this->cpb_cnt_minus1 = 0;
  this->initial_cpb_removal_delay_length_minus1 = '\x17';
  this->cpb_removal_delay_length_minus1 = '\x17';
  this->dpb_output_delay_length_minus1 = '\x17';
  this->time_offset_length = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->cbr_flag,1);
  *(this->cbr_flag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\0';
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->bit_rate_value_minus1,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cpb_size_value_minus1,1);
  bVar3 = (int)CONCAT71(in_register_00000031,mvc) != 0;
  uVar1 = 0x1312c;
  if (bVar3) {
    uVar1 = 0x39386;
  }
  uVar2 = 0x7270d;
  if (!bVar3) {
    uVar2 = 0x39386;
  }
  this->bit_rate_scale = mvc ^ 3;
  this->cpb_size_scale = '\x03';
  *(this->bit_rate_value_minus1).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
   _M_impl.super__Vector_impl_data._M_start = uVar1;
  *(this->cpb_size_value_minus1).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
   _M_impl.super__Vector_impl_data._M_start = uVar2;
  return;
}

Assistant:

void HRDParams::resetDefault(const bool mvc)
{
    isPresent = false;
    bitLen = 0;

    initial_cpb_removal_delay_length_minus1 = 23;
    cpb_removal_delay_length_minus1 = 23;
    dpb_output_delay_length_minus1 = 23;
    time_offset_length = 0;

    cpb_cnt_minus1 = 0;
    cbr_flag.resize(1);
    cbr_flag[0] = 0;

    bit_rate_value_minus1.resize(1);
    cpb_size_value_minus1.resize(1);

    // todo: implement different parameters for MVC and AVC here
    if (!mvc)
    {
        bit_rate_scale = 3;
        cpb_size_scale = 3;
        bit_rate_value_minus1[0] = 78124;  // 78124*512 = 40 mbit. It is max allowed value for Blu-ray disks
        cpb_size_value_minus1[0] =
            234374;  // 234374*128 = 30 mbit per frame max. It is max allowed value for Blu-ray disks
    }
    else
    {
        bit_rate_scale = 2;
        cpb_size_scale = 3;
        bit_rate_value_minus1[0] = 234374;  // 60 mbit for MVC+AVC It is max allowed value for Blu-ray disks
        cpb_size_value_minus1[0] = 468749;
    }
}